

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

bool __thiscall
JsUtil::ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer> *this,
          JITJavascriptString **item)

{
  bool bVar1;
  int local_24;
  int i;
  JITJavascriptString **item_local;
  ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->count <= local_24) {
      return false;
    }
    bVar1 = DefaultComparer<JITJavascriptString_*>::Equals(*item,this->buffer[local_24]);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }